

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid,REF_INT pri,REF_INT tet0,REF_INT tet1)

{
  REF_INT *pRVar1;
  uint uVar2;
  int iVar3;
  REF_CELL pRVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  REF_INT new_pyr;
  REF_INT pyr_nodes [27];
  REF_INT tet1_nodes [27];
  REF_INT tet0_nodes [27];
  REF_INT pri_nodes [27];
  ulong local_230;
  REF_INT local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_188 [28];
  int local_118 [28];
  REF_INT local_a8 [30];
  
  uVar2 = ref_cell_nodes(ref_grid->cell[10],pri,local_a8);
  if (uVar2 == 0) {
    uVar2 = ref_cell_nodes(ref_grid->cell[8],tet0,local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2f0
             ,"ref_layer_tet_to_pyr",(ulong)uVar2,"tet0 nodes");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_grid->cell[8],tet1,local_188);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2f1
             ,"ref_layer_tet_to_pyr",(ulong)uVar2,"tet1 nodes");
      return uVar2;
    }
    pRVar4 = ref_grid->cell[10];
    if (pRVar4->face_per < 1) {
      local_230._0_4_ = -1;
    }
    else {
      local_230 = 0xffffffff;
      lVar9 = 0;
      uVar10 = 0;
      RVar6 = 0;
      do {
        pRVar1 = pRVar4->f2n;
        if (pRVar1[uVar10 * 4] != pRVar1[uVar10 * 4 + 3]) {
          lVar11 = 0;
          uVar2 = 0;
          do {
            iVar3 = local_a8[*(int *)((long)pRVar1 + lVar11 * 4 + lVar9)];
            uVar2 = uVar2 + (iVar3 == local_188[3] ||
                            ((iVar3 == local_188[2] ||
                             (iVar3 == local_188[1] || iVar3 == local_188[0])) ||
                            ((iVar3 == local_118[3] || iVar3 == local_118[2]) ||
                            (iVar3 == local_118[1] || iVar3 == local_118[0]))));
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          if (uVar2 != 2) {
            if (uVar2 != 4) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x302,"ref_layer_tet_to_pyr","hits not 2 or 4");
              printf("hits %d\n",(ulong)uVar2);
              goto LAB_002083c6;
            }
            iVar3 = (int)local_230;
            if (iVar3 != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x304,"ref_layer_tet_to_pyr","two quad faces",0xffffffffffffffff,(long)iVar3);
              RVar6 = 1;
            }
            local_230 = uVar10 & 0xffffffff;
            if (iVar3 != -1) {
              return RVar6;
            }
          }
        }
        uVar10 = uVar10 + 1;
        pRVar4 = ref_grid->cell[10];
        lVar9 = lVar9 + 0x10;
      } while ((long)uVar10 < (long)pRVar4->face_per);
    }
    if ((int)local_230 == -1) {
      pcVar8 = "quad face not set";
      uVar5 = 0x309;
    }
    else {
      pRVar1 = pRVar4->f2n;
      local_1f8 = local_a8[pRVar1[(int)local_230 * 4]];
      local_1f4 = local_a8[pRVar1[(int)local_230 * 4 + 1]];
      local_1e8 = local_a8[pRVar1[(int)local_230 * 4 + 2]];
      local_1ec = local_a8[pRVar1[(int)local_230 * 4 + 3]];
      local_1f0 = -1;
      lVar9 = 0;
      do {
        iVar3 = local_118[lVar9];
        iVar7 = local_1f0;
        if ((((local_1f8 != iVar3) && (local_1f4 != iVar3)) && (local_1e8 != iVar3)) &&
           ((local_1ec != iVar3 && (iVar7 = iVar3, local_1f0 != iVar3 && local_1f0 != -1)))) {
          pcVar8 = "multiple off nodes";
          uVar5 = 0x318;
          goto LAB_002083bf;
        }
        iVar3 = local_188[lVar9];
        local_1f0 = iVar7;
        if (((local_1f8 != iVar3) && (local_1f4 != iVar3)) &&
           ((local_1e8 != iVar3 &&
            ((local_1ec != iVar3 && (local_1f0 = iVar3, iVar7 != iVar3 && iVar7 != -1)))))) {
          pcVar8 = "multiple off nodes";
          uVar5 = 0x31e;
          local_1f0 = iVar7;
          goto LAB_002083bf;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      if (local_1f0 != -1) {
        uVar2 = ref_cell_remove(ref_grid->cell[8],tet0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x324,"ref_layer_tet_to_pyr",(ulong)uVar2,"rm tet0");
          return uVar2;
        }
        uVar2 = ref_cell_remove(ref_grid->cell[8],tet1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x325,"ref_layer_tet_to_pyr",(ulong)uVar2,"rm tet1");
          return uVar2;
        }
        uVar2 = ref_cell_add(ref_grid->cell[9],&local_1f8,&local_1fc);
        if (uVar2 == 0) {
          return 0;
        }
        pcVar8 = "add pyr";
        uVar5 = 0x327;
        goto LAB_00207e86;
      }
      pcVar8 = "pyramid peak not set";
      uVar5 = 0x322;
    }
LAB_002083bf:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar5,
           "ref_layer_tet_to_pyr",pcVar8);
LAB_002083c6:
    uVar2 = 1;
  }
  else {
    pcVar8 = "pri nodes";
    uVar5 = 0x2ef;
LAB_00207e86:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar5,
           "ref_layer_tet_to_pyr",(ulong)uVar2,pcVar8);
  }
  return uVar2;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid, REF_INT pri,
                                               REF_INT tet0, REF_INT tet1) {
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet0_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet1_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_face, i, hits, quad_node, quad_face, new_pyr;

  RSS(ref_cell_nodes(ref_grid_pri(ref_grid), pri, pri_nodes), "pri nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet0, tet0_nodes), "tet0 nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet1, tet1_nodes), "tet1 nodes");

  quad_face = REF_EMPTY;
  each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
    if (ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, cell_face) !=
        ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, cell_face)) {
      hits = 0;
      for (i = 0; i < 4; i++) {
        quad_node =
            pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), i, cell_face)];
        if (quad_node == tet0_nodes[0] || quad_node == tet0_nodes[1] ||
            quad_node == tet0_nodes[2] || quad_node == tet0_nodes[3] ||
            quad_node == tet1_nodes[0] || quad_node == tet1_nodes[1] ||
            quad_node == tet1_nodes[2] || quad_node == tet1_nodes[3])
          hits++;
      }
      RAB(hits == 2 || hits == 4, "hits not 2 or 4",
          { printf("hits %d\n", hits); });
      if (4 == hits) {
        REIS(REF_EMPTY, quad_face, "two quad faces");
        quad_face = cell_face;
      }
    }
  }
  RUS(REF_EMPTY, quad_face, "quad face not set");
  /* aflr winding, quad points into prism */
  pyr_nodes[0] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, quad_face)];
  pyr_nodes[1] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 1, quad_face)];
  pyr_nodes[4] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 2, quad_face)];
  pyr_nodes[3] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, quad_face)];
  pyr_nodes[2] = REF_EMPTY;
  for (i = 0; i < 4; i++) {
    if (pyr_nodes[0] != tet0_nodes[i] && pyr_nodes[1] != tet0_nodes[i] &&
        pyr_nodes[4] != tet0_nodes[i] && pyr_nodes[3] != tet0_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet0_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet0_nodes[i];
    }
    if (pyr_nodes[0] != tet1_nodes[i] && pyr_nodes[1] != tet1_nodes[i] &&
        pyr_nodes[4] != tet1_nodes[i] && pyr_nodes[3] != tet1_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet1_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet1_nodes[i];
    }
  }
  RUS(REF_EMPTY, pyr_nodes[2], "pyramid peak not set");

  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet0), "rm tet0");
  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet1), "rm tet1");

  RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_pyr), "add pyr");

  return REF_SUCCESS;
}